

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_func.cpp
# Opt level: O0

unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>
 __thiscall
pfederc::Parser::fromExprDeclToFunctionParam
          (Parser *this,unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *expr,
          unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *guard,
          unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *guardResult)

{
  bool bVar1;
  type pEVar2;
  Expr *pEVar3;
  TokenExpr *this_00;
  pointer pEVar4;
  pointer local_158;
  pointer local_118;
  bool local_d8 [8];
  undefined1 local_d0 [8];
  unique_ptr<pfederc::UnOpExpr,_std::default_delete<pfederc::UnOpExpr>_> local_c8;
  unique_ptr<pfederc::UnOpExpr,_std::default_delete<pfederc::UnOpExpr>_> unopexpr_1;
  bool ismutable;
  unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> typeexpr;
  Expr *local_a8;
  undefined1 local_a0 [28];
  undefined4 local_84;
  undefined1 local_80 [24];
  undefined1 local_68 [16];
  unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> local_58;
  unique_ptr<pfederc::UnOpExpr,_std::default_delete<pfederc::UnOpExpr>_> local_50;
  unique_ptr<pfederc::UnOpExpr,_std::default_delete<pfederc::UnOpExpr>_> unopexpr;
  bool ismutable_1;
  unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> idexpr;
  BiOpExpr *biopdcl;
  unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *guardResult_local;
  unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *guard_local;
  unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *expr_local;
  Parser *this_local;
  
  pEVar2 = std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::operator*(guard);
  bVar1 = isBiOpExpr(pEVar2,TOK_OP_DCL);
  if (bVar1) {
    pEVar2 = std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::operator*(guard);
    idexpr._M_t.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
    super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
    super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl =
         (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)
         __dynamic_cast(pEVar2,&Expr::typeinfo,&BiOpExpr::typeinfo,0);
    if ((tuple<pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>)
        idexpr._M_t.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
        super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
        super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl ==
        (_Head_base<0UL,_pfederc::Expr_*,_false>)0x0) {
      __cxa_bad_cast();
    }
    std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>::
    unique_ptr<std::default_delete<pfederc::Expr>,void>
              ((unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>> *)
               &stack0xffffffffffffffc0);
    pEVar3 = BiOpExpr::getLeft((BiOpExpr *)
                               idexpr._M_t.
                               super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>
                               .super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl);
    bVar1 = isUnOpExpr(pEVar3,TOK_OP_BAND);
    if (bVar1) {
      BiOpExpr::getLeftPtr((BiOpExpr *)&local_58);
      pEVar4 = std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::release
                         (&local_58);
      if (pEVar4 == (pointer)0x0) {
        local_118 = (pointer)0x0;
      }
      else {
        local_118 = (pointer)__dynamic_cast(pEVar4,&Expr::typeinfo,&UnOpExpr::typeinfo,0);
      }
      std::unique_ptr<pfederc::UnOpExpr,std::default_delete<pfederc::UnOpExpr>>::
      unique_ptr<std::default_delete<pfederc::UnOpExpr>,void>
                ((unique_ptr<pfederc::UnOpExpr,std::default_delete<pfederc::UnOpExpr>> *)&local_50,
                 local_118);
      std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::~unique_ptr(&local_58);
      unopexpr._M_t.
      super___uniq_ptr_impl<pfederc::UnOpExpr,_std::default_delete<pfederc::UnOpExpr>_>._M_t.
      super__Tuple_impl<0UL,_pfederc::UnOpExpr_*,_std::default_delete<pfederc::UnOpExpr>_>.
      super__Head_base<0UL,_pfederc::UnOpExpr_*,_false>._M_head_impl._7_1_ = 1;
      std::unique_ptr<pfederc::UnOpExpr,_std::default_delete<pfederc::UnOpExpr>_>::operator->
                (&local_50);
      UnOpExpr::getExpressionPtr((UnOpExpr *)(local_68 + 8));
      std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::operator=
                ((unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)
                 &stack0xffffffffffffffc0,
                 (unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)(local_68 + 8));
      std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::~unique_ptr
                ((unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)(local_68 + 8));
      std::unique_ptr<pfederc::UnOpExpr,_std::default_delete<pfederc::UnOpExpr>_>::~unique_ptr
                (&local_50);
    }
    else {
      BiOpExpr::getLeftPtr((BiOpExpr *)local_68);
      std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::operator=
                ((unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)
                 &stack0xffffffffffffffc0,
                 (unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)local_68);
      std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::~unique_ptr
                ((unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)local_68);
      unopexpr._M_t.
      super___uniq_ptr_impl<pfederc::UnOpExpr,_std::default_delete<pfederc::UnOpExpr>_>._M_t.
      super__Tuple_impl<0UL,_pfederc::UnOpExpr_*,_std::default_delete<pfederc::UnOpExpr>_>.
      super__Head_base<0UL,_pfederc::UnOpExpr_*,_false>._M_head_impl._7_1_ = 0;
    }
    pEVar2 = std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::operator*
                       ((unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)
                        &stack0xffffffffffffffc0);
    bVar1 = isTokenExpr(pEVar2,TOK_ID);
    if (bVar1) {
      pEVar3 = BiOpExpr::getRight((BiOpExpr *)
                                  idexpr._M_t.
                                  super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>
                                  .super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl);
      bVar1 = isUnOpExpr(pEVar3,TOK_OP_BAND);
      if (bVar1) {
        local_a0._6_2_ = 2;
        local_a0._0_4_ = 7;
        pEVar3 = BiOpExpr::getRight((BiOpExpr *)
                                    idexpr._M_t.
                                    super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>
                                    .super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl);
        Expr::getPosition(pEVar3);
        std::
        make_unique<pfederc::Error<pfederc::SyntaxErrorCode>,pfederc::Level,pfederc::SyntaxErrorCode,pfederc::Position_const&>
                  ((Level *)(local_a0 + 8),(SyntaxErrorCode *)(local_a0 + 6),(Position *)local_a0);
        generateError((Parser *)(local_a0 + 0x10),
                      (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                       *)expr);
        std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
                  ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
                   (local_a0 + 0x10));
        std::
        unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
        ::~unique_ptr((unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                       *)(local_a0 + 8));
        std::
        unique_ptr<std::tuple<pfederc::Token_const*,bool,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>>,std::default_delete<std::tuple<pfederc::Token_const*,bool,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>>>>
        ::
        unique_ptr<std::default_delete<std::tuple<pfederc::Token_const*,bool,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>>>,void>
                  ((unique_ptr<std::tuple<pfederc::Token_const*,bool,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>>,std::default_delete<std::tuple<pfederc::Token_const*,bool,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>>>>
                    *)this,(nullptr_t)0x0);
      }
      else {
        pEVar2 = std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::operator*
                           ((unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)
                            &stack0xffffffffffffffc0);
        this_00 = (TokenExpr *)__dynamic_cast(pEVar2,&Expr::typeinfo,&TokenExpr::typeinfo,0);
        if (this_00 == (TokenExpr *)0x0) {
          __cxa_bad_cast();
        }
        local_a8 = (Expr *)TokenExpr::getToken(this_00);
        BiOpExpr::getRightPtr((BiOpExpr *)&typeexpr);
        std::
        make_unique<std::tuple<pfederc::Token_const*,bool,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>>,pfederc::Token_const*,bool&,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>>
                  ((Token **)this,(bool *)&local_a8,
                   (unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)
                   ((long)&unopexpr._M_t.
                           super___uniq_ptr_impl<pfederc::UnOpExpr,_std::default_delete<pfederc::UnOpExpr>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_pfederc::UnOpExpr_*,_std::default_delete<pfederc::UnOpExpr>_>
                           .super__Head_base<0UL,_pfederc::UnOpExpr_*,_false>._M_head_impl + 7),
                   &typeexpr,guardResult);
        std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::~unique_ptr(&typeexpr);
      }
    }
    else {
      local_80._6_2_ = 2;
      local_80._0_4_ = 6;
      pEVar4 = std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::operator->
                         ((unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)
                          &stack0xffffffffffffffc0);
      Expr::getPosition(pEVar4);
      std::
      make_unique<pfederc::Error<pfederc::SyntaxErrorCode>,pfederc::Level,pfederc::SyntaxErrorCode,pfederc::Position_const&>
                ((Level *)(local_80 + 8),(SyntaxErrorCode *)(local_80 + 6),(Position *)local_80);
      generateError((Parser *)(local_80 + 0x10),
                    (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                     *)expr);
      std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
                ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
                 (local_80 + 0x10));
      std::
      unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
      ::~unique_ptr((unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                     *)(local_80 + 8));
      std::
      unique_ptr<std::tuple<pfederc::Token_const*,bool,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>>,std::default_delete<std::tuple<pfederc::Token_const*,bool,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>>>>
      ::
      unique_ptr<std::default_delete<std::tuple<pfederc::Token_const*,bool,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>>>,void>
                ((unique_ptr<std::tuple<pfederc::Token_const*,bool,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>>,std::default_delete<std::tuple<pfederc::Token_const*,bool,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>>>>
                  *)this,(nullptr_t)0x0);
    }
    local_84 = 1;
    std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::~unique_ptr
              ((unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)
               &stack0xffffffffffffffc0);
  }
  else {
    std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>::
    unique_ptr<std::default_delete<pfederc::Expr>,void>
              ((unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>> *)
               &stack0xffffffffffffff48);
    pEVar2 = std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::operator*(guard);
    bVar1 = isUnOpExpr(pEVar2,TOK_OP_MUT);
    if (bVar1) {
      pEVar4 = std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::release(guard);
      if (pEVar4 == (pointer)0x0) {
        local_158 = (pointer)0x0;
      }
      else {
        local_158 = (pointer)__dynamic_cast(pEVar4,&Expr::typeinfo,&UnOpExpr::typeinfo,0);
      }
      std::unique_ptr<pfederc::UnOpExpr,std::default_delete<pfederc::UnOpExpr>>::
      unique_ptr<std::default_delete<pfederc::UnOpExpr>,void>
                ((unique_ptr<pfederc::UnOpExpr,std::default_delete<pfederc::UnOpExpr>> *)&local_c8,
                 local_158);
      std::unique_ptr<pfederc::UnOpExpr,_std::default_delete<pfederc::UnOpExpr>_>::operator->
                (&local_c8);
      UnOpExpr::getExpressionPtr((UnOpExpr *)local_d0);
      std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::operator=
                ((unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)
                 &stack0xffffffffffffff48,
                 (unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)local_d0);
      std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::~unique_ptr
                ((unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)local_d0);
      unopexpr_1._M_t.
      super___uniq_ptr_impl<pfederc::UnOpExpr,_std::default_delete<pfederc::UnOpExpr>_>._M_t.
      super__Tuple_impl<0UL,_pfederc::UnOpExpr_*,_std::default_delete<pfederc::UnOpExpr>_>.
      super__Head_base<0UL,_pfederc::UnOpExpr_*,_false>._M_head_impl._7_1_ = 1;
      std::unique_ptr<pfederc::UnOpExpr,_std::default_delete<pfederc::UnOpExpr>_>::~unique_ptr
                (&local_c8);
    }
    else {
      std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::operator=
                ((unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)
                 &stack0xffffffffffffff48,guard);
      unopexpr_1._M_t.
      super___uniq_ptr_impl<pfederc::UnOpExpr,_std::default_delete<pfederc::UnOpExpr>_>._M_t.
      super__Tuple_impl<0UL,_pfederc::UnOpExpr_*,_std::default_delete<pfederc::UnOpExpr>_>.
      super__Head_base<0UL,_pfederc::UnOpExpr_*,_false>._M_head_impl._7_1_ = 0;
    }
    local_d8[0] = false;
    local_d8[1] = false;
    local_d8[2] = false;
    local_d8[3] = false;
    local_d8[4] = false;
    local_d8[5] = false;
    local_d8[6] = false;
    local_d8[7] = false;
    std::
    make_unique<std::tuple<pfederc::Token_const*,bool,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>>,decltype(nullptr),bool&,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>>
              (&this->lexer,local_d8,
               (unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)
               ((long)&unopexpr_1._M_t.
                       super___uniq_ptr_impl<pfederc::UnOpExpr,_std::default_delete<pfederc::UnOpExpr>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_pfederc::UnOpExpr_*,_std::default_delete<pfederc::UnOpExpr>_>
                       .super__Head_base<0UL,_pfederc::UnOpExpr_*,_false>._M_head_impl + 7),
               (unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)
               &stack0xffffffffffffff48,guardResult);
    local_84 = 1;
    std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::~unique_ptr
              ((unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)
               &stack0xffffffffffffff48);
  }
  return (__uniq_ptr_data<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>,_true,_true>
          )(__uniq_ptr_data<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<FuncParameter> Parser::fromExprDeclToFunctionParam(
    std::unique_ptr<Expr> &&expr, std::unique_ptr<Expr> &&guard,
    std::unique_ptr<Expr> &&guardResult) noexcept {
  // '&'id ':' expr | id ':' expr | '&' expr | expr
  if (isBiOpExpr(*expr, TokenType::TOK_OP_DCL)) {
    // '&'id ':' expr | id ':' expr
    BiOpExpr &biopdcl = dynamic_cast<BiOpExpr&>(*expr);

    std::unique_ptr<Expr> idexpr;
    bool ismutable;
    if (isUnOpExpr(biopdcl.getLeft(), TokenType::TOK_OP_BAND)) {
      std::unique_ptr<UnOpExpr> unopexpr =
          std::unique_ptr<UnOpExpr>(dynamic_cast<UnOpExpr*>(biopdcl.getLeftPtr().release()));
      ismutable = true;
      idexpr = unopexpr->getExpressionPtr();
    } else {
      idexpr = biopdcl.getLeftPtr();
      ismutable = false;
    }

    if (!isTokenExpr(*idexpr, TokenType::TOK_ID)) {
      generateError(std::make_unique<SyntaxError>(LVL_ERROR,
        SyntaxErrorCode::STX_ERR_INVALID_VARDECL_ID, idexpr->getPosition()));
      return nullptr;
    }

    if (isUnOpExpr(biopdcl.getRight(), TokenType::TOK_OP_BAND)) {
      generateError(std::make_unique<SyntaxError>(LVL_ERROR,
        SyntaxErrorCode::STX_ERR_INVALID_VARDECL, biopdcl.getRight().getPosition()));
      return nullptr;
    }

    return std::make_unique<FuncParameter>(
      &dynamic_cast<const TokenExpr&>(*idexpr).getToken(),
      ismutable,
      biopdcl.getRightPtr(),
      std::move(guard), std::move(guardResult));
  }
  // '&' expr | expr
  std::unique_ptr<Expr> typeexpr;
  bool ismutable;
  if (isUnOpExpr(*expr, TokenType::TOK_OP_MUT)) {
    std::unique_ptr<UnOpExpr> unopexpr =
      std::unique_ptr<UnOpExpr>(dynamic_cast<UnOpExpr*>(expr.release()));
    typeexpr = unopexpr->getExpressionPtr();
    ismutable = true;
  } else {
    typeexpr = std::move(expr);
    ismutable = false;
  }

  return std::make_unique<FuncParameter>(
    nullptr, ismutable, std::move(typeexpr),
    std::move(guard), std::move(guardResult));
}